

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O0

pair<int,_double>
alex::fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
          (undefined8 param_1,undefined8 param_2,uint param_3,long param_4,int param_5,
          undefined8 param_6,int param_7,undefined4 param_8,byte param_9,byte param_10)

{
  undefined1 auVar1 [64];
  initializer_list<alex::fanout_tree::FTNode> __l;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pFVar5;
  uint uVar6;
  pair<int,_double> pVar7;
  FTNode *tree_node;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  double cost;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  int fanout_tree_level;
  int fanout;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  vector<double,_std::allocator<double>_> fanout_costs;
  double best_cost;
  int best_level;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe48;
  value_type vVar8;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  *in_stack_fffffffffffffe50;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined1 *best_cost_00;
  undefined4 in_stack_fffffffffffffe70;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  local_160;
  reference local_158;
  int local_150;
  double local_148;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  local_140;
  int local_124;
  int local_120;
  undefined1 local_119;
  undefined1 local_118 [16];
  undefined1 auStack_108 [48];
  ulong local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  local_98;
  vector<double,_std::allocator<double>_> local_80;
  double local_68;
  int local_60;
  byte local_5a;
  byte local_59;
  undefined8 local_58;
  int local_4c;
  undefined8 local_48;
  int local_3c;
  long local_38;
  uint local_2c;
  undefined8 local_28;
  uint local_18;
  vector<double,_std::allocator<double>_> *local_10;
  vector<double,_std::allocator<double>_> *this;
  
  local_59 = param_9 & 1;
  local_5a = param_10 & 1;
  local_60 = 0;
  local_68 = *(double *)(param_4 + 0x20) + 20.0;
  local_58 = param_1;
  local_4c = param_7;
  local_48 = param_6;
  local_3c = param_5;
  local_38 = param_4;
  local_2c = param_3;
  local_28 = param_2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10c7a9);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::vector((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
            *)0x10c7b6);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe30,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auStack_108 = auVar1._16_48_;
  local_118._0_8_ = auVar1._0_8_;
  local_118._8_8_ = local_68;
  auStack_108._4_4_ = local_2c;
  auStack_108._9_39_ = auVar1._25_39_;
  auStack_108[8] = 0;
  local_d8 = (ulong)local_2c;
  local_d0 = local_118;
  local_c8 = 1;
  best_cost_00 = &local_119;
  std::allocator<alex::fanout_tree::FTNode>::allocator
            ((allocator<alex::fanout_tree::FTNode> *)0x10c84c);
  __l._M_len._0_4_ = in_stack_fffffffffffffe60;
  __l._M_array = (iterator)in_stack_fffffffffffffe58;
  __l._M_len._4_4_ = in_stack_fffffffffffffe64;
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
            (in_stack_fffffffffffffe50,__l,in_stack_fffffffffffffe48);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::push_back((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              (value_type *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::~vector
            (in_stack_fffffffffffffe30);
  std::allocator<alex::fanout_tree::FTNode>::~allocator
            ((allocator<alex::fanout_tree::FTNode> *)0x10c8a1);
  local_124 = 1;
  for (local_120 = 2; local_120 <= local_4c; local_120 = local_120 << 1) {
    in_stack_fffffffffffffe58 = &local_140;
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               0x10c8dd);
    uVar6 = local_5a & 1;
    in_stack_fffffffffffffe20 = local_59 & 1;
    in_stack_fffffffffffffe18 = param_8;
    local_148 = compute_level<int,int,alex::AlexCompare>
                          (local_58,local_28,local_2c,local_38,local_3c,in_stack_fffffffffffffe58,
                           local_124);
    in_stack_fffffffffffffe60 = SUB84(local_148,0);
    in_stack_fffffffffffffe64 = (int)((ulong)local_148 >> 0x20);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe30,
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe2c,uVar6));
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
    if (sVar3 < 3) {
LAB_0010cad8:
      if (local_148 < local_68) {
        local_68 = local_148;
        local_60 = local_124;
      }
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                   *)in_stack_fffffffffffffe30,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe2c,uVar6));
      local_150 = 0;
    }
    else {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,sVar3 - 1);
      vVar8 = *pvVar4;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,sVar3 - 2);
      if (vVar8 <= *pvVar4) goto LAB_0010cad8;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,sVar3 - 2);
      vVar8 = *pvVar4;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,sVar3 - 3);
      if (vVar8 <= *pvVar4) goto LAB_0010cad8;
      local_150 = 2;
    }
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::~vector
              (in_stack_fffffffffffffe30);
    if (local_150 != 0) break;
    local_124 = local_124 + 1;
  }
  local_158 = std::
              vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
              ::operator[](&local_98,(long)local_60);
  local_160._M_current =
       (FTNode *)
       std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::begin
                 ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                  CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::end
            ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)), bVar2
        ) {
    pFVar5 = __gnu_cxx::
             __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
             ::operator*(&local_160);
    pFVar5->use = true;
    __gnu_cxx::
    __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
    ::operator++(&local_160);
  }
  local_68 = merge_nodes_upwards<int,int>
                       (param_5,(double)best_cost_00,in_stack_fffffffffffffe64,
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  collect_used_nodes((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                      *)CONCAT44(param_5,in_stack_fffffffffffffe70),
                     (int)((ulong)best_cost_00 >> 0x20),
                     (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  pVar7 = std::make_pair<int&,double&>
                    ((int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (double *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this = (vector<double,_std::allocator<double>_> *)pVar7.second;
  local_18 = pVar7.first;
  local_150 = 1;
  local_10 = this;
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
             *)this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  pVar7._4_4_ = 0;
  pVar7.first = local_18;
  pVar7.second = (double)local_10;
  return pVar7;
}

Assistant:

std::pair<int, double> find_best_fanout_bottom_up(
    const std::pair<T, P> values[], int num_keys, const AlexNode<T, P>* node,
    int total_keys, std::vector<FTNode>& used_fanout_tree_nodes, int max_fanout,
    int max_data_node_keys, double expected_insert_frac = 0,
    bool approximate_model_computation = true,
    bool approximate_cost_computation = false, Compare key_less = Compare()) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  int best_level = 0;
  double best_cost = node->cost_ + kNodeLookupsWeight;
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;
  fanout_costs.push_back(best_cost);
  fanout_tree.push_back(
      {{0, 0, best_cost, 0, num_keys, false, 0, 0, 0, 0, num_keys}});
  for (int fanout = 2, fanout_tree_level = 1; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = compute_level<T, P, Compare>(
        values, num_keys, node, total_keys, new_level, fanout_tree_level,
        max_data_node_keys, expected_insert_frac, approximate_model_computation,
        approximate_cost_computation, key_less);
    fanout_costs.push_back(cost);
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  best_cost = merge_nodes_upwards<T, P>(best_level, best_cost, num_keys,
                                        total_keys, fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return std::make_pair(best_level, best_cost);
}